

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1_util.cpp
# Opt level: O2

bool cfd::core::CheckTweakAddXonlyPubkey
               (SchnorrPubkey *tweaked_pubkey,SchnorrPubkey *base_pubkey,ByteData256 *tweak,
               bool parity)

{
  int iVar1;
  secp256k1_context_struct *ctx;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tweak_bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tweak_xonly_key;
  secp256k1_xonly_pubkey base_xonly_key;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_a0;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  secp256k1_xonly_pubkey local_70;
  
  ctx = wally_get_secp_context();
  SchnorrPubkey::GetData((ByteData *)&local_70,tweaked_pubkey);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_88,
                     (ByteData *)&local_70);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_70);
  ParseXOnlyPubkey(&local_70,base_pubkey);
  ByteData256::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a0,tweak);
  iVar1 = secp256k1_xonly_pubkey_tweak_add_check
                    (ctx,local_88._M_impl.super__Vector_impl_data._M_start,(uint)parity,&local_70,
                     local_a0._M_impl.super__Vector_impl_data._M_start);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_a0);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_88);
  return iVar1 == 1;
}

Assistant:

bool CheckTweakAddXonlyPubkey(
    const SchnorrPubkey& tweaked_pubkey, const SchnorrPubkey& base_pubkey,
    const ByteData256& tweak, bool parity) {
  auto ctx = wally_get_secp_context();
  std::vector<uint8_t> tweak_xonly_key = tweaked_pubkey.GetData().GetBytes();
  auto base_xonly_key = ParseXOnlyPubkey(base_pubkey);
  std::vector<uint8_t> tweak_bytes = tweak.GetBytes();
  int tweaked_pk_parity = (parity) ? 1 : 0;

  int ret = secp256k1_xonly_pubkey_tweak_add_check(
      ctx, tweak_xonly_key.data(), tweaked_pk_parity, &base_xonly_key,
      tweak_bytes.data());

  return (ret == 1);
}